

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::yarn3>(yarn3 *r,string *name)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  undefined8 uStack_38;
  
  uVar7 = name->_M_string_length;
  uStack_38 = in_RAX;
  while (uVar7 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar7 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar7);
  iVar9 = 0xf;
  do {
    iVar1 = (r->S).r[0];
    iVar2 = (r->S).r[1];
    uVar7 = (long)(r->S).r[2] * (long)(r->P).a[2] +
            (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar1;
    uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
    uVar7 = uVar8 - 0xfffffffe;
    if (uVar8 < 0xfffffffe) {
      uVar7 = uVar8;
    }
    (r->S).r[2] = iVar2;
    (r->S).r[1] = iVar1;
    uVar3 = (uint)uVar7 + 0x80000001;
    if (uVar7 < 0x7fffffff) {
      uVar3 = (uint)uVar7;
    }
    (r->S).r[0] = uVar3;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar5 = (uint)((ulong)*(uint *)(trng::yarn3::g + (ulong)(uVar3 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn3::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000)) &
              0x7fffffff;
      iVar1 = (int)((ulong)*(uint *)(trng::yarn3::g + (ulong)(uVar3 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn3::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >>
                   0x1f);
      uVar6 = uVar5 + iVar1;
      uVar3 = uVar5 + 0x80000001 + iVar1;
      if (uVar6 < 0x7fffffff) {
        uVar3 = uVar6;
      }
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
    uStack_38._0_7_ = CONCAT16(9,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 6),1);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  iVar9 = (r->S).r[0];
  iVar1 = (r->S).r[1];
  uVar7 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar9;
  uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
  uVar7 = uVar8 - 0xfffffffe;
  if (uVar8 < 0xfffffffe) {
    uVar7 = uVar8;
  }
  (r->S).r[2] = iVar1;
  (r->S).r[1] = iVar9;
  uVar3 = (uint)uVar7 + 0x80000001;
  if (uVar7 < 0x7fffffff) {
    uVar3 = (uint)uVar7;
  }
  (r->S).r[0] = uVar3;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = (uint)((ulong)*(uint *)(trng::yarn3::g + (ulong)(uVar3 & 0xffff) * 4) *
                  (ulong)*(uint *)(trng::yarn3::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000)) &
            0x7fffffff;
    iVar9 = (int)((ulong)*(uint *)(trng::yarn3::g + (ulong)(uVar3 & 0xffff) * 4) *
                  (ulong)*(uint *)(trng::yarn3::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >>
                 0x1f);
    uVar6 = uVar5 + iVar9;
    uVar3 = uVar5 + 0x80000001 + iVar9;
    if (uVar6 < 0x7fffffff) {
      uVar3 = uVar6;
    }
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}